

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_list.cpp
# Opt level: O3

PGList * duckdb_libpgquery::list_delete_cell(PGList *list,PGListCell *cell,PGListCell *prev)

{
  PGList *pPVar1;
  
  if (list->length == 1) {
    list_free(list);
    list = (PGList *)0x0;
  }
  else {
    list->length = list->length + -1;
    pPVar1 = (PGList *)prev;
    if (prev == (PGListCell *)0x0) {
      pPVar1 = list;
    }
    pPVar1->head = cell->next;
    if (list->tail == cell) {
      list->tail = prev;
    }
    pfree(cell);
  }
  return list;
}

Assistant:

PGList *
list_delete_cell(PGList *list, PGListCell *cell, PGListCell *prev)
{
	check_list_invariants(list);
	Assert(prev != NULL ? lnext(prev) == cell : list_head(list) == cell);

	/*
	 * If we're about to delete the last node from the list, free the whole
	 * list instead and return NIL, which is the only valid representation of
	 * a zero-length list.
	 */
	if (list->length == 1)
	{
		list_free(list);
		return NIL;
	}

	/*
	 * Otherwise, adjust the necessary list links, deallocate the particular
	 * node we have just removed, and return the list we were given.
	 */
	list->length--;

	if (prev)
		prev->next = cell->next;
	else
		list->head = cell->next;

	if (list->tail == cell)
		list->tail = prev;

	pfree(cell);
	return list;
}